

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O3

CURLcode Curl_conn_send(Curl_easy *data,int sockindex,void *buf,size_t blen,_Bool eos,
                       size_t *pnwritten)

{
  uint in_EAX;
  size_t sVar1;
  size_t sVar2;
  CURLcode result;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  sVar1 = (*data->conn->send[sockindex])
                    (data,sockindex,buf,blen,eos,(CURLcode *)((long)&uStack_18 + 4));
  sVar2 = 0;
  if (0 < (long)sVar1) {
    sVar2 = sVar1;
  }
  *pnwritten = sVar2;
  return uStack_18._4_4_;
}

Assistant:

CURLcode Curl_conn_send(struct Curl_easy *data, int sockindex,
                        const void *buf, size_t blen, bool eos,
                        size_t *pnwritten)
{
  size_t write_len = blen;
  ssize_t nwritten;
  CURLcode result = CURLE_OK;
  struct connectdata *conn;

  DEBUGASSERT(sockindex >= 0 && sockindex < 2);
  DEBUGASSERT(pnwritten);
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  conn = data->conn;
#ifdef DEBUGBUILD
  {
    /* Allow debug builds to override this logic to force short sends
    */
    char *p = getenv("CURL_SMALLSENDS");
    if(p) {
      size_t altsize = (size_t)strtoul(p, NULL, 10);
      if(altsize)
        write_len = CURLMIN(write_len, altsize);
    }
  }
#endif
  if(write_len != blen)
    eos = FALSE;
  nwritten = conn->send[sockindex](data, sockindex, buf, write_len, eos,
                                   &result);
  DEBUGASSERT((nwritten >= 0) || result);
  *pnwritten = (nwritten < 0) ? 0 : (size_t)nwritten;
  return result;
}